

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_fmt.c
# Opt level: O0

void beltFMTStepD(u16 *buf,octet *iv,void *state)

{
  u16 *str;
  u32 *in_RDX;
  octet *in_RSI;
  u16 *in_RDI;
  word unaff_retaddr;
  size_t i;
  belt_fmt_st *st;
  u32 *in_stack_ffffffffffffffc8;
  u32 *in_stack_ffffffffffffffd0;
  u16 *str_00;
  u32 *puVar1;
  
  puVar1 = in_RDX;
  if (in_RSI == (octet *)0x0) {
    memSet(in_stack_ffffffffffffffd0,(octet)((ulong)in_stack_ffffffffffffffc8 >> 0x38),0x15ab8c);
  }
  else {
    memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x15ab71);
  }
  str_00 = (u16 *)0x3;
  while (str = (u16 *)((long)str_00 + -1), str_00 != (u16 *)0x0) {
    beltStr2Bin(in_RSI,(size_t)puVar1,(u32)((ulong)in_RDX >> 0x20),str,
                (size_t)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffd0 = in_RDX + *(long *)(in_RDX + 0x18) * 2 + 0x22;
    beltH();
    memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x15ac29);
    memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x15ac6c);
    if (*(long *)(in_RDX + 0x18) == 1) {
      beltBlockEncr((octet *)(in_RDX + 0x22),in_RDX);
      str_00 = str;
    }
    else if (*(long *)(in_RDX + 0x18) == 2) {
      belt32BlockEncr((octet *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      str_00 = str;
    }
    else {
      beltWBLStepE(in_RDX,(size_t)str,in_stack_ffffffffffffffd0);
      str_00 = str;
    }
    beltBin2StrSub(unaff_retaddr,in_RDI,(size_t)in_RSI,(octet *)puVar1,(size_t)in_RDX);
    beltStr2Bin(in_RSI,(size_t)puVar1,(u32)((ulong)in_RDX >> 0x20),str_00,
                (size_t)in_stack_ffffffffffffffd0);
    in_stack_ffffffffffffffc8 = in_RDX + *(long *)(in_RDX + 0x1a) * 2 + 0x22;
    beltH();
    memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x15ada4);
    memCopy(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x15ade3);
    if (*(long *)(in_RDX + 0x1a) == 1) {
      beltBlockEncr((octet *)(in_RDX + 0x22),in_RDX);
    }
    else if (*(long *)(in_RDX + 0x1a) == 2) {
      belt32BlockEncr((octet *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    }
    else {
      beltWBLStepE(in_RDX,(size_t)str_00,in_stack_ffffffffffffffd0);
    }
    beltBin2StrSub(unaff_retaddr,in_RDI,(size_t)in_RSI,(octet *)puVar1,(size_t)in_RDX);
  }
  return;
}

Assistant:

void beltFMTStepD(u16 buf[], const octet iv[16], void* state)
{
	belt_fmt_st* st = (belt_fmt_st*)state;
	size_t i;
	ASSERT(memIsValid(state, sizeof(belt_fmt_st)));
	ASSERT(memIsValid(state, beltFMT_keep(st->mod, st->n1 + st->n2)));
	ASSERT(memIsNullOrValid(iv, 16));
	ASSERT(memIsValid(buf, 2 * st->n1 + 2 * st->n2));
	// подготовить синхропосылку
	if (iv)
		memCopy(st->iv + 4, iv, 16);
	else
		memSetZero(st->iv + 4, 16);
	// такты
	for (i = 3; i--;)
	{
		// вторая половинка
		beltStr2Bin(st->buf, st->b1, st->mod, buf, st->n1);
		memCopy(st->buf + st->b1 * 8, beltH() + 8 * i + 4, 4);
		memCopy(st->buf + st->b1 * 8 + 4, st->iv + 8 * i + 4, 4);
		if (st->b1 == 1)
			beltBlockEncr(st->buf, st->wbl->key);
		else if (st->b1 == 2)
			belt32BlockEncr(st->buf, st->wbl->key);
		else
			beltWBLStepE(st->buf, 8 * st->b1 + 8, st->wbl);
		beltBin2StrSub(st->mod, buf + st->n1, st->n2, st->buf, st->b1 + 1);
		// первая половинка
		beltStr2Bin(st->buf, st->b2, st->mod, buf + st->n1, st->n2);
		memCopy(st->buf + st->b2 * 8, beltH() + 8 * i, 4);
		memCopy(st->buf + st->b2 * 8 + 4, st->iv + 8 * i, 4);
		if (st->b2 == 1)
			beltBlockEncr(st->buf, st->wbl->key);
		else if (st->b2 == 2)
			belt32BlockEncr(st->buf, st->wbl->key);
		else
			beltWBLStepE(st->buf, 8 * st->b2 + 8, st->wbl);
		beltBin2StrSub(st->mod, buf, st->n1, st->buf, st->b2 + 1);
	}	
}